

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int have_chromaticities(png_const_structrp png_ptr)

{
  png_const_structrp png_ptr_local;
  
  if ((png_ptr->chunks & 0x10000) == 0) {
    if ((png_ptr->chunks & 0x800000) == 0) {
      if ((png_ptr->chunks & 0x40) == 0) {
        png_ptr_local._4_4_ = 0;
      }
      else {
        png_ptr_local._4_4_ = 1;
      }
    }
    else {
      png_ptr_local._4_4_ = 0;
    }
  }
  else {
    png_ptr_local._4_4_ = 1;
  }
  return png_ptr_local._4_4_;
}

Assistant:

static int
have_chromaticities(png_const_structrp png_ptr)
{
   /* Handle new PNGv3 chunks and the precedence rules to determine whether
    * png_struct::chromaticities must be processed.  Only required for RGB to
    * gray.
    *
    * mDCV: this is the mastering colour space and it is independent of the
    *       encoding so it needs to be used regardless of the encoded space.
    *
    * cICP: first in priority but not yet implemented - the chromaticities come
    *       from the 'primaries'.
    *
    * iCCP: not supported by libpng (so ignored)
    *
    * sRGB: the defaults match sRGB
    *
    * cHRM: calculate the coefficients
    */
#  ifdef PNG_READ_mDCV_SUPPORTED
      if (png_has_chunk(png_ptr, mDCV))
         return 1;
#     define check_chromaticities 1
#  endif /*mDCV*/

#  ifdef PNG_READ_sRGB_SUPPORTED
      if (png_has_chunk(png_ptr, sRGB))
         return 0;
#  endif /*sRGB*/

#  ifdef PNG_READ_cHRM_SUPPORTED
      if (png_has_chunk(png_ptr, cHRM))
         return 1;
#     define check_chromaticities 1
#  endif /*cHRM*/

   return 0; /* sRGB defaults */
}